

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_ComputeMemoryUsage(JSRuntime *rt,JSMemoryUsage *s)

{
  int iVar1;
  uint32_t uVar2;
  long lVar3;
  JSShape *sh_00;
  JSAtomStruct *p_00;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue val_06;
  JSValue val_07;
  JSValue val_08;
  uint uVar4;
  BOOL BVar5;
  size_t sVar6;
  long lVar7;
  undefined8 *in_RSI;
  long in_RDI;
  double dVar8;
  JSAtomStruct *p_1;
  int hash_size_2;
  JSShape *sh_2;
  JSArrayBuffer *abuf;
  JSForInIterator *it;
  JSCFunctionDataRecord *fd;
  JSBoundFunction *bf;
  double ref_count;
  JSVarRef **var_refs;
  JSFunctionBytecode *b;
  int hash_size_1;
  JSProperty *pr;
  JSShapeProperty *prs;
  JSShape *sh_1;
  JSObject *p;
  JSGCObjectHeader *gp;
  JSExportEntry *me;
  JSModuleDef *m;
  int hash_size;
  JSShape *sh;
  JSContext *ctx;
  JSMemoryUsage_helper *hp;
  JSMemoryUsage_helper mem;
  int i;
  list_head *el1;
  list_head *el;
  JSValueUnion in_stack_fffffffffffffed8;
  ulong in_stack_fffffffffffffee0;
  JSMemoryUsage_helper *in_stack_fffffffffffffef8;
  long lVar9;
  JSFunctionBytecode *in_stack_ffffffffffffff00;
  JSShapeProperty *local_b8;
  JSMemoryUsage_helper local_68;
  uint local_24;
  long local_20;
  long local_18;
  undefined8 *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_68,0,0x40);
  memset(local_10,0,0xd0);
  local_10[3] = *(undefined8 *)(local_8 + 0x20);
  *local_10 = *(undefined8 *)(local_8 + 0x28);
  local_10[1] = *(undefined8 *)(local_8 + 0x30);
  local_10[4] = 2;
  local_10[2] = (long)*(int *)(local_8 + 0x6c) * 0x10 + 400;
  for (local_18 = *(long *)(local_8 + 0x80); lVar9 = local_18, local_18 != local_8 + 0x78;
      local_18 = *(long *)(local_18 + 8)) {
    lVar3 = *(long *)(local_18 + 0x18);
    local_10[4] = local_10[4] + 2;
    local_10[2] = (long)*(int *)(local_8 + 0x6c) * 0x10 + 0x1c0 + local_10[2];
    local_10[0x18] = (ulong)*(ushort *)(local_18 + 0x10) + local_10[0x18];
    local_10[0x19] = (long)*(int *)(local_18 + 0x14) + local_10[0x19];
    if ((lVar3 != 0) && (*(char *)(lVar3 + 0x18) == '\0')) {
      iVar1 = *(int *)(lVar3 + 0x20);
      local_10[0xd] = local_10[0xd] + 1;
      sVar6 = get_shape_size((long)(iVar1 + 1),(long)*(int *)(lVar3 + 0x24));
      local_10[0xe] = sVar6 + local_10[0xe];
    }
    for (local_20 = *(long *)(lVar9 + 0x180); lVar3 = local_20, local_20 != lVar9 + 0x178;
        local_20 = *(long *)(local_20 + 8)) {
      local_10[4] = local_10[4] + 1;
      local_10[2] = local_10[2] + 0xa8;
      if (*(long *)(local_20 + 0x10) != 0) {
        local_10[4] = local_10[4] + 1;
        local_10[2] = (long)*(int *)(local_20 + 0x18) * 0x10 + local_10[2];
      }
      if (*(long *)(local_20 + 0x20) != 0) {
        local_10[4] = local_10[4] + 1;
        local_10[2] = (long)*(int *)(local_20 + 0x28) * 0x20 + local_10[2];
        for (local_24 = 0; (int)local_24 < *(int *)(lVar3 + 0x28); local_24 = local_24 + 1) {
          lVar7 = *(long *)(lVar3 + 0x20) + (long)(int)local_24 * 0x20;
          if ((*(int *)(lVar7 + 0x10) == 0) && (*(long *)(lVar7 + 8) != 0)) {
            local_10[4] = local_10[4] + 1;
            val.tag = in_stack_fffffffffffffee0;
            val.u.ptr = in_stack_fffffffffffffed8.ptr;
            compute_value_size(val,(JSMemoryUsage_helper *)0x1246dc);
          }
        }
      }
      if (*(long *)(lVar3 + 0x30) != 0) {
        local_10[4] = local_10[4] + 1;
        local_10[2] = (long)*(int *)(lVar3 + 0x38) * 4 + local_10[2];
      }
      if (*(long *)(lVar3 + 0x40) != 0) {
        local_10[4] = local_10[4] + 1;
        local_10[2] = (long)*(int *)(lVar3 + 0x48) * 0xc + local_10[2];
      }
      val_00.tag = in_stack_fffffffffffffee0;
      val_00.u.ptr = in_stack_fffffffffffffed8.ptr;
      compute_value_size(val_00,(JSMemoryUsage_helper *)0x124799);
      val_01.tag = in_stack_fffffffffffffee0;
      val_01.u.ptr = in_stack_fffffffffffffed8.ptr;
      compute_value_size(val_01,(JSMemoryUsage_helper *)0x1247b6);
    }
  }
  local_18 = *(long *)(local_8 + 0x90);
  do {
    lVar9 = local_18;
    if (local_18 == local_8 + 0x88) {
      local_10[10] = local_10[9] * 0x48 + local_10[10];
      local_10[4] = local_10[4] + 1;
      local_10[2] = (long)*(int *)(local_8 + 0x174) * 8 + local_10[2];
      for (local_24 = 0; (int)local_24 < *(int *)(local_8 + 0x174); local_24 = local_24 + 1) {
        for (lVar9 = *(long *)(*(long *)(local_8 + 0x180) + (long)(int)local_24 * 8); lVar9 != 0;
            lVar9 = *(long *)(lVar9 + 0x30)) {
          iVar1 = *(int *)(lVar9 + 0x20);
          local_10[0xd] = local_10[0xd] + 1;
          sVar6 = get_shape_size((long)(iVar1 + 1),(long)*(int *)(lVar9 + 0x24));
          local_10[0xe] = sVar6 + local_10[0xe];
        }
      }
      local_10[4] = local_10[4] + 2;
      local_10[5] = (long)*(int *)(local_8 + 0x4c);
      local_10[6] = (long)*(int *)(local_8 + 0x50) * 8 + (long)*(int *)(local_8 + 0x48) * 4;
      for (local_24 = 0; (int)local_24 < *(int *)(local_8 + 0x50); local_24 = local_24 + 1) {
        p_00 = *(JSAtomStruct **)(*(long *)(local_8 + 0x60) + (long)(int)local_24 * 8);
        BVar5 = atom_is_free(p_00);
        if (BVar5 == 0) {
          local_10[6] = (((long)(int)(((uint)*(undefined8 *)&p_00->field_0x4 & 0x7fffffff) <<
                                     ((byte)(*(ulong *)&p_00->field_0x4 >> 0x1f) & 1)) + 0x11) -
                        (ulong)((byte)(*(ulong *)&p_00->field_0x4 >> 0x1f) & 1)) + local_10[6];
        }
      }
      dVar8 = round(local_68.str_count);
      local_10[7] = (long)dVar8;
      dVar8 = round(local_68.str_size);
      local_10[8] = (long)dVar8;
      local_10[0xf] = local_68.js_func_count;
      dVar8 = round(local_68.js_func_size);
      local_10[0x10] = (long)dVar8;
      local_10[0x11] = local_68.js_func_code_size;
      local_10[0x12] = local_68.js_func_pc2line_count;
      local_10[0x13] = local_68.js_func_pc2line_size;
      dVar8 = round(local_68.memory_used_count);
      local_10[4] = (long)((double)(long)local_10[4] +
                          dVar8 + (double)(long)local_10[5] + (double)(long)local_10[7] +
                          (double)(long)local_10[9] + (double)(long)local_10[0xd] +
                          (double)(long)local_10[0xf] + (double)(long)local_10[0x12]);
      local_10[2] = local_10[6] + local_10[8] + local_10[10] + local_10[0xc] + local_10[0xe] +
                    local_10[0x10] + local_10[0x11] + local_10[0x13] + local_10[2];
      return;
    }
    if ((*(byte *)(local_18 + -4) & 0xf) == 1) {
      compute_bytecode_size(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    else if ((*(byte *)(local_18 + -4) & 0xf) == 0) {
      sh_00 = *(JSShape **)(local_18 + 0x10);
      local_10[9] = local_10[9] + 1;
      if (*(long *)(local_18 + 0x18) != 0) {
        local_10[4] = local_10[4] + 1;
        local_10[0xc] = (long)sh_00->prop_size * 0x10 + local_10[0xc];
        local_10[0xb] = (long)sh_00->prop_count + local_10[0xb];
        local_b8 = get_shape_prop(sh_00);
        for (local_24 = 0; (int)local_24 < sh_00->prop_count; local_24 = local_24 + 1) {
          if ((local_b8->atom != 0) && ((*(uint *)local_b8 >> 0x1a & 0x30) == 0)) {
            val_02.tag = in_stack_fffffffffffffee0;
            val_02.u.ptr = in_stack_fffffffffffffed8.ptr;
            compute_value_size(val_02,(JSMemoryUsage_helper *)0x124993);
          }
          local_b8 = local_b8 + 1;
        }
      }
      if (sh_00->is_hashed == '\0') {
        uVar2 = sh_00->prop_hash_mask;
        local_10[0xd] = local_10[0xd] + 1;
        sVar6 = get_shape_size((long)(int)(uVar2 + 1),(long)sh_00->prop_size);
        local_10[0xe] = sVar6 + local_10[0xe];
      }
      uVar4 = *(ushort *)(lVar9 + -2) - 2;
      in_stack_fffffffffffffee0 = (ulong)uVar4;
      switch(in_stack_fffffffffffffee0) {
      case 0:
      case 6:
        local_10[0x15] = local_10[0x15] + 1;
        if (((*(byte *)(lVar9 + -3) >> 3 & 1) != 0) &&
           (local_10[0x16] = local_10[0x16] + 1, *(long *)(lVar9 + 0x30) != 0)) {
          local_10[4] = local_10[4] + 1;
          local_10[2] = (ulong)*(uint *)(lVar9 + 0x38) * 0x10 + local_10[2];
          local_10[0x17] = (ulong)*(uint *)(lVar9 + 0x38) + local_10[0x17];
          for (local_24 = 0; local_24 < *(uint *)(lVar9 + 0x38); local_24 = local_24 + 1) {
            val_03.tag = in_stack_fffffffffffffee0;
            val_03.u.ptr = in_stack_fffffffffffffed8.ptr;
            compute_value_size(val_03,(JSMemoryUsage_helper *)0x124b46);
          }
        }
        break;
      case 2:
      case 3:
      case 4:
      case 5:
      case 8:
        val_04.tag._0_4_ = uVar4;
        val_04.u.ptr = in_stack_fffffffffffffed8.ptr;
        val_04.tag._4_4_ = 0;
        compute_value_size(val_04,(JSMemoryUsage_helper *)0x124b7f);
        break;
      case 10:
        local_10[0x14] = local_10[0x14] + 1;
        break;
      case 0xb:
        lVar3 = *(long *)(lVar9 + 0x28);
        lVar9 = *(long *)(lVar9 + 0x30);
        if (lVar9 != 0) {
          local_10[4] = local_10[4] + 1;
          local_10[0x10] = (long)*(int *)(lVar3 + 0x5c) * 8 + local_10[0x10];
          for (local_24 = 0; (int)local_24 < *(int *)(lVar3 + 0x5c); local_24 = local_24 + 1) {
            if (*(long *)(lVar9 + (long)(int)local_24 * 8) != 0) {
              dVar8 = (double)**(int **)(lVar9 + (long)(int)local_24 * 8);
              local_10[4] = (long)((double)(long)local_10[4] + 1.0 / dVar8);
              local_10[0x10] = (long)((double)(long)local_10[0x10] + 48.0 / dVar8);
              if (*(long *)(*(long *)(lVar9 + (long)(int)local_24 * 8) + 0x18) ==
                  *(long *)(lVar9 + (long)(int)local_24 * 8) + 0x20) {
                val_05.tag = in_stack_fffffffffffffee0;
                val_05.u.ptr = in_stack_fffffffffffffed8.ptr;
                compute_value_size(val_05,(JSMemoryUsage_helper *)0x124d08);
              }
            }
          }
        }
        break;
      case 0xc:
        lVar9 = *(long *)(lVar9 + 0x28);
        for (local_24 = 0; (int)local_24 < *(int *)(lVar9 + 0x20); local_24 = local_24 + 1) {
          val_06.tag = in_stack_fffffffffffffee0;
          val_06.u.ptr = in_stack_fffffffffffffed8.ptr;
          compute_value_size(val_06,(JSMemoryUsage_helper *)0x124d82);
        }
        local_10[4] = local_10[4] + 1;
        local_10[2] = (long)*(int *)(lVar9 + 0x20) * 0x10 + 0x28 + local_10[2];
        break;
      case 0xd:
        lVar9 = *(long *)(lVar9 + 0x28);
        if (lVar9 != 0) {
          for (local_24 = 0; (int)local_24 < (int)(uint)*(byte *)(lVar9 + 9);
              local_24 = local_24 + 1) {
            val_07.tag = in_stack_fffffffffffffee0;
            val_07.u.ptr = in_stack_fffffffffffffed8.ptr;
            compute_value_size(val_07,(JSMemoryUsage_helper *)0x124e37);
          }
          local_10[4] = local_10[4] + 1;
          local_10[2] = (ulong)*(byte *)(lVar9 + 9) * 0x10 + 0x10 + local_10[2];
        }
        break;
      case 0xf:
        if (*(long *)(lVar9 + 0x28) != 0) {
          val_08.tag._0_4_ = uVar4;
          val_08.u.ptr = in_stack_fffffffffffffed8.ptr;
          val_08.tag._4_4_ = 0;
          compute_value_size(val_08,(JSMemoryUsage_helper *)0x124eef);
          local_10[4] = local_10[4] + 1;
          local_10[2] = local_10[2] + 0x20;
        }
        break;
      case 0x10:
        compute_jsstring_size(*(JSString **)(lVar9 + 0x28),&local_68);
        compute_jsstring_size(*(JSString **)(lVar9 + 0x30),&local_68);
        break;
      case 0x11:
      case 0x12:
        in_stack_ffffffffffffff00 = *(JSFunctionBytecode **)(lVar9 + 0x28);
        if (in_stack_ffffffffffffff00 != (JSFunctionBytecode *)0x0) {
          local_10[4] = local_10[4] + 1;
          local_10[2] = local_10[2] + 0x30;
          if ((in_stack_ffffffffffffff00->header).link.prev != (list_head *)0x0) {
            local_10[4] = local_10[4] + 1;
            local_10[2] = (long)(in_stack_ffffffffffffff00->header).ref_count + local_10[2];
          }
        }
        break;
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2c:
      case 0x2d:
      case 0x2e:
      case 0x30:
      default:
        if (*(long *)(lVar9 + 0x28) != 0) {
          local_10[4] = local_10[4] + 1;
        }
      }
    }
    local_18 = *(long *)(local_18 + 8);
  } while( true );
}

Assistant:

void JS_ComputeMemoryUsage(JSRuntime *rt, JSMemoryUsage *s)
{
    struct list_head *el, *el1;
    int i;
    JSMemoryUsage_helper mem = { 0 }, *hp = &mem;

    memset(s, 0, sizeof(*s));
    s->malloc_count = rt->malloc_state.malloc_count;
    s->malloc_size = rt->malloc_state.malloc_size;
    s->malloc_limit = rt->malloc_state.malloc_limit;

    s->memory_used_count = 2; /* rt + rt->class_array */
    s->memory_used_size = sizeof(JSRuntime) + sizeof(JSValue) * rt->class_count;

    list_for_each(el, &rt->context_list) {
        JSContext *ctx = list_entry(el, JSContext, link);
        JSShape *sh = ctx->array_shape;
        s->memory_used_count += 2; /* ctx + ctx->class_proto */
        s->memory_used_size += sizeof(JSContext) +
            sizeof(JSValue) * rt->class_count;
        s->binary_object_count += ctx->binary_object_count;
        s->binary_object_size += ctx->binary_object_size;

        /* the hashed shapes are counted separately */
        if (sh && !sh->is_hashed) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }
        list_for_each(el1, &ctx->loaded_modules) {
            JSModuleDef *m = list_entry(el1, JSModuleDef, link);
            s->memory_used_count += 1;
            s->memory_used_size += sizeof(*m);
            if (m->req_module_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->req_module_entries_count * sizeof(*m->req_module_entries);
            }
            if (m->export_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->export_entries_count * sizeof(*m->export_entries);
                for (i = 0; i < m->export_entries_count; i++) {
                    JSExportEntry *me = &m->export_entries[i];
                    if (me->export_type == JS_EXPORT_TYPE_LOCAL && me->u.local.var_ref) {
                        /* potential multiple count */
                        s->memory_used_count += 1;
                        compute_value_size(me->u.local.var_ref->value, hp);
                    }
                }
            }
            if (m->star_export_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->star_export_entries_count * sizeof(*m->star_export_entries);
            }
            if (m->import_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->import_entries_count * sizeof(*m->import_entries);
            }
            compute_value_size(m->module_ns, hp);
            compute_value_size(m->func_obj, hp);
        }
    }

    list_for_each(el, &rt->gc_obj_list) {
        JSGCObjectHeader *gp = list_entry(el, JSGCObjectHeader, link);
        JSObject *p;
        JSShape *sh;
        JSShapeProperty *prs;

        /* XXX: could count the other GC object types too */
        if (gp->gc_obj_type == JS_GC_OBJ_TYPE_FUNCTION_BYTECODE) {
            compute_bytecode_size((JSFunctionBytecode *)gp, hp);
            continue;
        } else if (gp->gc_obj_type != JS_GC_OBJ_TYPE_JS_OBJECT) {
            continue;
        }
        p = (JSObject *)gp;
        sh = p->shape;
        s->obj_count++;
        if (p->prop) {
            s->memory_used_count++;
            s->prop_size += sh->prop_size * sizeof(*p->prop);
            s->prop_count += sh->prop_count;
            prs = get_shape_prop(sh);
            for(i = 0; i < sh->prop_count; i++) {
                JSProperty *pr = &p->prop[i];
                if (prs->atom != JS_ATOM_NULL && !(prs->flags & JS_PROP_TMASK)) {
                    compute_value_size(pr->u.value, hp);
                }
                prs++;
            }
        }
        /* the hashed shapes are counted separately */
        if (!sh->is_hashed) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }

        switch(p->class_id) {
        case JS_CLASS_ARRAY:             /* u.array | length */
        case JS_CLASS_ARGUMENTS:         /* u.array | length */
            s->array_count++;
            if (p->fast_array) {
                s->fast_array_count++;
                if (p->u.array.u.values) {
                    s->memory_used_count++;
                    s->memory_used_size += p->u.array.count *
                        sizeof(*p->u.array.u.values);
                    s->fast_array_elements += p->u.array.count;
                    for (i = 0; i < p->u.array.count; i++) {
                        compute_value_size(p->u.array.u.values[i], hp);
                    }
                }
            }
            break;
        case JS_CLASS_NUMBER:            /* u.object_data */
        case JS_CLASS_STRING:            /* u.object_data */
        case JS_CLASS_BOOLEAN:           /* u.object_data */
        case JS_CLASS_SYMBOL:            /* u.object_data */
        case JS_CLASS_DATE:              /* u.object_data */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT:           /* u.object_data */
        case JS_CLASS_BIG_FLOAT:         /* u.object_data */
        case JS_CLASS_BIG_DECIMAL:         /* u.object_data */
#endif
            compute_value_size(p->u.object_data, hp);
            break;
        case JS_CLASS_C_FUNCTION:        /* u.cfunc */
            s->c_func_count++;
            break;
        case JS_CLASS_BYTECODE_FUNCTION: /* u.func */
            {
                JSFunctionBytecode *b = p->u.func.function_bytecode;
                JSVarRef **var_refs = p->u.func.var_refs;
                /* home_object: object will be accounted for in list scan */
                if (var_refs) {
                    s->memory_used_count++;
                    s->js_func_size += b->closure_var_count * sizeof(*var_refs);
                    for (i = 0; i < b->closure_var_count; i++) {
                        if (var_refs[i]) {
                            double ref_count = var_refs[i]->header.ref_count;
                            s->memory_used_count += 1 / ref_count;
                            s->js_func_size += sizeof(*var_refs[i]) / ref_count;
                            /* handle non object closed values */
                            if (var_refs[i]->pvalue == &var_refs[i]->value) {
                                /* potential multiple count */
                                compute_value_size(var_refs[i]->value, hp);
                            }
                        }
                    }
                }
            }
            break;
        case JS_CLASS_BOUND_FUNCTION:    /* u.bound_function */
            {
                JSBoundFunction *bf = p->u.bound_function;
                /* func_obj and this_val are objects */
                for (i = 0; i < bf->argc; i++) {
                    compute_value_size(bf->argv[i], hp);
                }
                s->memory_used_count += 1;
                s->memory_used_size += sizeof(*bf) + bf->argc * sizeof(*bf->argv);
            }
            break;
        case JS_CLASS_C_FUNCTION_DATA:   /* u.c_function_data_record */
            {
                JSCFunctionDataRecord *fd = p->u.c_function_data_record;
                if (fd) {
                    for (i = 0; i < fd->data_len; i++) {
                        compute_value_size(fd->data[i], hp);
                    }
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*fd) + fd->data_len * sizeof(*fd->data);
                }
            }
            break;
        case JS_CLASS_REGEXP:            /* u.regexp */
            compute_jsstring_size(p->u.regexp.pattern, hp);
            compute_jsstring_size(p->u.regexp.bytecode, hp);
            break;

        case JS_CLASS_FOR_IN_ITERATOR:   /* u.for_in_iterator */
            {
                JSForInIterator *it = p->u.for_in_iterator;
                if (it) {
                    compute_value_size(it->obj, hp);
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*it);
                }
            }
            break;
        case JS_CLASS_ARRAY_BUFFER:      /* u.array_buffer */
        case JS_CLASS_SHARED_ARRAY_BUFFER: /* u.array_buffer */
            {
                JSArrayBuffer *abuf = p->u.array_buffer;
                if (abuf) {
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*abuf);
                    if (abuf->data) {
                        s->memory_used_count += 1;
                        s->memory_used_size += abuf->byte_length;
                    }
                }
            }
            break;
        case JS_CLASS_GENERATOR:         /* u.generator_data */
        case JS_CLASS_UINT8C_ARRAY:      /* u.typed_array / u.array */
        case JS_CLASS_INT8_ARRAY:        /* u.typed_array / u.array */
        case JS_CLASS_UINT8_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_INT16_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_UINT16_ARRAY:      /* u.typed_array / u.array */
        case JS_CLASS_INT32_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_UINT32_ARRAY:      /* u.typed_array / u.array */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT64_ARRAY:   /* u.typed_array / u.array */
        case JS_CLASS_BIG_UINT64_ARRAY:  /* u.typed_array / u.array */
#endif
        case JS_CLASS_FLOAT32_ARRAY:     /* u.typed_array / u.array */
        case JS_CLASS_FLOAT64_ARRAY:     /* u.typed_array / u.array */
        case JS_CLASS_DATAVIEW:          /* u.typed_array */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_FLOAT_ENV:         /* u.float_env */
#endif
        case JS_CLASS_MAP:               /* u.map_state */
        case JS_CLASS_SET:               /* u.map_state */
        case JS_CLASS_WEAKMAP:           /* u.map_state */
        case JS_CLASS_WEAKSET:           /* u.map_state */
        case JS_CLASS_MAP_ITERATOR:      /* u.map_iterator_data */
        case JS_CLASS_SET_ITERATOR:      /* u.map_iterator_data */
        case JS_CLASS_ARRAY_ITERATOR:    /* u.array_iterator_data */
        case JS_CLASS_STRING_ITERATOR:   /* u.array_iterator_data */
        case JS_CLASS_PROXY:             /* u.proxy_data */
        case JS_CLASS_PROMISE:           /* u.promise_data */
        case JS_CLASS_PROMISE_RESOLVE_FUNCTION:  /* u.promise_function_data */
        case JS_CLASS_PROMISE_REJECT_FUNCTION:   /* u.promise_function_data */
        case JS_CLASS_ASYNC_FUNCTION_RESOLVE:    /* u.async_function_data */
        case JS_CLASS_ASYNC_FUNCTION_REJECT:     /* u.async_function_data */
        case JS_CLASS_ASYNC_FROM_SYNC_ITERATOR:  /* u.async_from_sync_iterator_data */
        case JS_CLASS_ASYNC_GENERATOR:   /* u.async_generator_data */
            /* TODO */
        default:
            /* XXX: class definition should have an opaque block size */
            if (p->u.opaque) {
                s->memory_used_count += 1;
            }
            break;
        }
    }
    s->obj_size += s->obj_count * sizeof(JSObject);

    /* hashed shapes */
    s->memory_used_count++; /* rt->shape_hash */
    s->memory_used_size += sizeof(rt->shape_hash[0]) * rt->shape_hash_size;
    for(i = 0; i < rt->shape_hash_size; i++) {
        JSShape *sh;
        for(sh = rt->shape_hash[i]; sh != NULL; sh = sh->shape_hash_next) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }
    }

    /* atoms */
    s->memory_used_count += 2; /* rt->atom_array, rt->atom_hash */
    s->atom_count = rt->atom_count;
    s->atom_size = sizeof(rt->atom_array[0]) * rt->atom_size +
        sizeof(rt->atom_hash[0]) * rt->atom_hash_size;
    for(i = 0; i < rt->atom_size; i++) {
        JSAtomStruct *p = rt->atom_array[i];
        if (!atom_is_free(p)) {
            s->atom_size += (sizeof(*p) + (p->len << p->is_wide_char) +
                             1 - p->is_wide_char);
        }
    }
    s->str_count = round(mem.str_count);
    s->str_size = round(mem.str_size);
    s->js_func_count = mem.js_func_count;
    s->js_func_size = round(mem.js_func_size);
    s->js_func_code_size = mem.js_func_code_size;
    s->js_func_pc2line_count = mem.js_func_pc2line_count;
    s->js_func_pc2line_size = mem.js_func_pc2line_size;
    s->memory_used_count += round(mem.memory_used_count) +
        s->atom_count + s->str_count +
        s->obj_count + s->shape_count +
        s->js_func_count + s->js_func_pc2line_count;
    s->memory_used_size += s->atom_size + s->str_size +
        s->obj_size + s->prop_size + s->shape_size +
        s->js_func_size + s->js_func_code_size + s->js_func_pc2line_size;
}